

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O2

void __thiscall
Am_Value_List_Data::Am_Value_List_Data(Am_Value_List_Data *this,Am_Value_List_Data *proto)

{
  Am_List_Item *pAVar1;
  Am_List_Item *this_00;
  Am_List_Item **ppAVar2;
  Am_List_Item *pAVar3;
  Am_List_Item **ppAVar4;
  
  (this->super_Am_Wrapper).refs = 1;
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_002eb1d8;
  ppAVar2 = &this->head;
  ppAVar4 = &proto->head;
  pAVar3 = (Am_List_Item *)0x0;
  while (pAVar1 = *ppAVar4, pAVar1 != (Am_List_Item *)0x0) {
    this_00 = (Am_List_Item *)operator_new(0x20);
    (this_00->super_Am_Value).type = 0;
    (this_00->super_Am_Value).value.wrapper_value = (Am_Wrapper *)0x0;
    this_00->prev = (Am_List_Item *)0x0;
    this_00->next = (Am_List_Item *)0x0;
    Am_List_Item::operator=(this_00,pAVar1);
    this_00->prev = pAVar3;
    *ppAVar2 = this_00;
    ppAVar2 = &this_00->next;
    pAVar3 = this_00;
    ppAVar4 = &pAVar1->next;
  }
  *ppAVar2 = (Am_List_Item *)0x0;
  this->tail = pAVar3;
  *(undefined2 *)&(this->super_Am_Wrapper).field_0xc =
       *(undefined2 *)&(proto->super_Am_Wrapper).field_0xc;
  return;
}

Assistant:

Am_Value_List_Data::Am_Value_List_Data(Am_Value_List_Data *proto)
{
  Am_List_Item *current;
  Am_List_Item *prev;
  Am_List_Item *new_item;
  Am_List_Item **list_position;
  list_position = &head;
  new_item = nullptr;
  prev = nullptr;
  for (current = proto->head; current; current = current->next) {
    new_item = new Am_List_Item;
    *new_item = *current;
    new_item->prev = prev;
    *list_position = new_item;
    prev = new_item;
    list_position = &(new_item->next);
  }
  *list_position = nullptr;
  tail = new_item;
  number = proto->number;
}